

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O1

void __thiscall VECTOR_HORI_VERT::Vector::Vector(Vector *this,string *filename,int N)

{
  string *__rhs;
  char cVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  int *__dest;
  invalid_argument *this_00;
  long *plVar5;
  long *plVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ofstream fil;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  this->_vptr_Vector = (_func_int **)&PTR___cxa_pure_virtual_00108ce8;
  __rhs = &this->filename_;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(__rhs->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_250,"Error! Cannot open file ",__rhs);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_270 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_270 == plVar6) {
      local_260 = *plVar6;
      lStack_258 = plVar5[3];
      local_270 = &local_260;
    }
    else {
      local_260 = *plVar6;
    }
    local_268 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::invalid_argument::invalid_argument(this_00,(string *)&local_270);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::close();
  uVar12 = (ulong)(uint)-N;
  if (0 < N) {
    uVar12 = (ulong)(uint)N;
  }
  this->znak = N >> 0x1f | 1;
  uVar7 = 1;
  uVar10 = 0;
  uVar9 = 0xffffffffffffffff;
  do {
    uVar4 = uVar9;
    uVar7 = uVar7 * 10;
    uVar9 = uVar4 + 1;
    uVar10 = uVar10 + 4;
  } while (uVar7 <= (uint)uVar12);
  uVar7 = (int)uVar4 + 2;
  this->L = uVar7;
  piVar2 = (int *)operator_new__(uVar10);
  lVar3 = uVar4 + 3;
  this->vector_ = piVar2;
  do {
    piVar2[(int)lVar3 - 2] = (int)uVar12 + (int)(uVar12 / 10) * -10;
    lVar3 = lVar3 + -1;
    uVar12 = uVar12 / 10;
  } while (1 < lVar3);
  uVar12 = 0;
  if (1 < uVar7) {
    uVar12 = 0;
    uVar4 = uVar9;
    do {
      if (0 < piVar2[uVar12]) goto LAB_001051c2;
      uVar12 = uVar12 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar12 = uVar9 & 0xffffffff;
  }
LAB_001051c2:
  iVar11 = (int)uVar12;
  if (iVar11 != 0) {
    iVar8 = ((int)uVar9 - iVar11) + 1;
    uVar4 = 0xffffffffffffffff;
    if (-1 < iVar8) {
      uVar4 = uVar10 + (long)iVar11 * -4;
    }
    __dest = (int *)operator_new__(uVar4);
    if (0 < iVar8) {
      memcpy(__dest,piVar2 + (uVar12 & 0xffffffff),(ulong)(uint)((int)uVar9 - iVar11) * 4 + 4);
    }
    operator_delete__(piVar2);
    this->vector_ = __dest;
    this->L = this->L - iVar11;
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___cxa_atexit;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

Vector::Vector(const std::string& filename, int N) {
    filename_ = filename;
    std::ofstream fil;
    fil.open(filename_.c_str(), std::ios_base::out | std::ios::trunc);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + filename_ + "!\n");
    }
    fil.close();
    if (N>=0){
        this->znak=1;
    }else{
        this->znak=-1;
    }
    N=std::abs(N);
    int tempy=1;
    for (int i=1;;i++){
        tempy*=10;
        if (tempy>N){
            this->L=i;
            break;
        }
    }
    this->vector_=new int[L];
    for(int i=L-1;i>=0;i--){
        this->vector_[i]=N%10;
        N=N/10;
    }
    int j=0;
    for (int i=0; i<L-1; i++){
        if (vector_[i]>0){
            break;
        }else{
            j+=1;
        }
    }
    if (j>0){
        int* vtemp;
        vtemp=new int[L-j];
        for (int i=0;i<L-j;i++){
            vtemp[i]=vector_[i+j];
        }
        delete [] vector_;
        this->vector_=vtemp;
        L=L-j;
    }
  }